

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  ofstream *poVar3;
  ostream *poVar4;
  VariableList *pVVar5;
  allocator local_59;
  string local_58 [48];
  uint local_28;
  undefined1 local_24 [4];
  int TestValue;
  int OptionIndex;
  int OptionSelected;
  int DidOneFlag;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  OptionIndex = 0;
  OutFile = (ostream *)&std::cout;
  CompileFlag = 0;
  KeepAllLines = 0;
  _OptionSelected = argv;
  argv_local._0_4_ = argc;
  initialize_node_type();
  do {
    TestValue = getopt_long((int)argv_local,_OptionSelected,OptionList,OptionListLong,local_24);
    pcVar1 = _optarg;
    if (TestValue == -1) {
      TestValue = -1;
      while( true ) {
        if ((int)argv_local <= _optind) {
          if (OptionIndex == 0) {
            xline = 1;
            include_stack_pointer = 0;
            yyin = _stdin;
            WriteHeader(OutFile,"Standard Input");
            if (PositionDump != 0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Parsing.");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            pVVar5 = (VariableList *)operator_new(0x20);
            VariableList::VariableList(pVVar5);
            Variables = pVVar5;
            iVar2 = yyparse();
            pVVar5 = Variables;
            if (iVar2 != 0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"%Failure during parse");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              pVVar5 = Variables;
              if (Variables != (VariableList *)0x0) {
                VariableList::~VariableList(Variables);
                operator_delete(pVVar5,0x20);
              }
              exit(1);
            }
            if (Variables != (VariableList *)0x0) {
              VariableList::~VariableList(Variables);
              operator_delete(pVVar5,0x20);
            }
          }
          if ((OutFile != (ostream *)&std::cout) && (OutFile != (ostream *)0x0)) {
            (**(code **)(*(long *)OutFile + 8))();
          }
          return 0;
        }
        OptionIndex = 1;
        xline = 1;
        include_stack_pointer = 0;
        yyin = (FILE *)fopen(_OptionSelected[_optind],"r");
        if ((FILE *)yyin == (FILE *)0x0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Unable to open input file ");
          poVar4 = std::operator<<(poVar4,_OptionSelected[_optind]);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        WriteHeader(OutFile,_OptionSelected[_optind]);
        if (PositionDump != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Parsing.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        pVVar5 = (VariableList *)operator_new(0x20);
        VariableList::VariableList(pVVar5);
        IntegerType = 10;
        RealType = VARTYPE_DOUBLE;
        Variables = pVVar5;
        iVar2 = yyparse();
        if (iVar2 != 0) break;
        fclose((FILE *)yyin);
        pVVar5 = Variables;
        if (Variables != (VariableList *)0x0) {
          VariableList::~VariableList(Variables);
          operator_delete(pVVar5,0x20);
        }
        _optind = _optind + 1;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"%Failure during parse");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pVVar5 = Variables;
      if (Variables != (VariableList *)0x0) {
        VariableList::~VariableList(Variables);
        operator_delete(pVVar5,0x20);
      }
      fclose((FILE *)yyin);
      exit(1);
    }
    switch(TestValue) {
    case 0x43:
    case 99:
      CompileFlag = 1;
      break;
    default:
      poVar4 = std::operator<<((ostream *)&std::cerr,"%Error on command line \'-h\' for help");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(1);
    case 0x48:
    case 0x68:
      OptionIndex = 1;
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "Usage: basic [-h] [-t<n>] [-v] [-c] [-p] [-l] [-I <path>] [-o <file>] <source>"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "   or: basic [--help] [--trace <n>] [--varlist] ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,
                               "       [--include <path>] [--compile] [--position] [--lines] [--output <file>] <source>"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      break;
    case 0x49:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,pcVar1,&local_59);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&include_abi_cxx11_,(value_type *)local_58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      break;
    case 0x4c:
    case 0x6c:
      KeepAllLines = 1;
      break;
    case 0x4f:
    case 0x6f:
      if (OutFile != (ostream *)&std::cout) {
        if (OutFile != (ostream *)0x0) {
          (**(code **)(*(long *)OutFile + 8))();
        }
        OutFile = (ostream *)0x0;
      }
      poVar3 = (ofstream *)operator_new(0x200);
      std::ofstream::ofstream(poVar3,_optarg,0x10);
      OutFile = (ostream *)poVar3;
      if (poVar3 == (ofstream *)0x0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Unable to open ");
        poVar4 = std::operator<<(poVar4,_optarg);
        poVar4 = std::operator<<(poVar4,"for output");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      break;
    case 0x50:
    case 0x70:
      PositionDump = 1;
      break;
    case 0x54:
    case 0x74:
      local_28 = (int)*_optarg - 0x30;
      if ((local_28 & 1) != 0) {
        DebugDump = 1;
      }
      if ((local_28 & 2) != 0) {
        DebugDumpOne = 1;
      }
      break;
    case 0x56:
    case 0x76:
      VariableDump = 1;
      break;
    case 0x69:
      DefaultType = VARTYPE_LONG;
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	//
	// Local Variables
	//
	int DidOneFlag = 0;
	int OptionSelected;
	int OptionIndex;
	int TestValue;

	//
	// Initialize variables
	//
	OutFile = &std::cout;
	CompileFlag = 0;
	KeepAllLines = false;

	initialize_node_type();

	//
	// Handle input arguments
	//
#ifdef USE_LONGOPT
	while ((OptionSelected = getopt_long(argc, argv, OptionList,
		OptionListLong, &OptionIndex)) != -1)
#else
	while ((OptionSelected = getopt(argc, argv, OptionList)) != -1)
#endif
	{
		//
		// Process one arguement
		//
		switch (OptionSelected)
		{
		case 't':
		case 'T':
			//
			// Tracing
			//
			TestValue = optarg[0] - '0';
			if (TestValue & 1)
			{
				DebugDump = true;
			}
			if (TestValue & 2)
			{
				DebugDumpOne = true;
			}
			break;

		case 'v':
		case 'V':
			//
			// Variable dump(s)
			//
			VariableDump = true;
			break;

		case 'o':
		case 'O':
			//
			// Output File
			//
			if (OutFile != &std::cout)
			{
				delete OutFile;
				OutFile = (std::ostream*)NULL;
			}

			OutFile = new std::ofstream(optarg);
			if (OutFile == (std::ostream*)NULL)
			{
				std::cerr << "Unable to open " << optarg <<
					"for output" << std::endl;
				exit(1);
			}

			break;

		case 'h':
		case 'H':
			DidOneFlag = 1;
			std::cerr << "Usage: basic [-h] [-t<n>] [-v] [-c] [-p] [-l] "
				"[-I <path>] [-o <file>] <source>" << std::endl;
			std::cerr << "   or: basic [--help] [--trace <n>] [--varlist] " << std::endl <<
			"       [--include <path>] [--compile] [--position] [--lines] [--output <file>] <source>" << std::endl;

			break;

		case 'c':
		case 'C':
			CompileFlag = 1;
			break;

		case 'p':
		case 'P':
			PositionDump = true;
			break;

		case 'l':
		case 'L':
			KeepAllLines = true;
			break;

		case 'i':
			DefaultType = VARTYPE_LONG;
			break;

		case 'I':
			include.push_back(optarg);
			break;

		default:
			std::cerr << "%Error on command line '-h' for help" << std::endl;
			exit(EXIT_FAILURE);
		}
	}

	//
	// Anything left over is files names to process
	//
	while (optind < argc)
	{
		//
		// At least one file name on command line
		//
		DidOneFlag = 1;

		//
		// Reset line counter
		//
		xline = 1;
		include_stack_pointer = 0;

		//
		// Open up source file
		//
		if ((yyin = fopen(argv[optind], "r")) == 0)
		{
			std::cerr << "Unable to open input file " <<
				argv[optind] << std::endl;
			exit(1);
		}

		WriteHeader(*OutFile, argv[optind]);

		//
		// Step 1. Parse the program. YACC will call the
		//  rest of the program if it scans correctly.
		//
		if (PositionDump)
		{
			std::cerr << "Parsing." << std::endl;
		}

		Variables = new VariableList;

		//
		// Default variable sizes
		//
		IntegerType = VARTYPE_LONG;
		RealType = VARTYPE_DOUBLE;

		if (yyparse() != 0)
		{
			std::cerr << "%Failure during parse" << std::endl;
			delete Variables;
			fclose(yyin);
			exit(1);
		}

		//
		// Close the input file
		//
		fclose(yyin);
		delete Variables;

		optind++;
	}

	//
	// If we haven't seen any file names, then get input
	// from the users terminal
	//
	if (DidOneFlag == 0)
	{
		//
		// Reset line counter
		//
		xline = 1;
		include_stack_pointer = 0;

		//
		// Read from standard input if we haven't handled
		// any input files yet.
		//
		yyin = stdin;

		WriteHeader(*OutFile, "Standard Input");

		if (PositionDump)
		{
			std::cerr << "Parsing." << std::endl;
		}

		Variables = new VariableList;

		if (yyparse() != 0)
		{
			std::cerr << "%Failure during parse" << std::endl;
			delete Variables;
			exit(1);
		}

		//
		// Close the input file
		//
		delete Variables;
	}

	if (OutFile != &std::cout)
	{
		delete OutFile;
	}

	return 0;
}